

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

type __thiscall
boost::spirit::terminal<boost::spirit::tag::byte_>::operator()
          (terminal<boost::spirit::tag::byte_> *this,uchar *_0_,is_false param_2)

{
  vector<unsigned_char> local_6b;
  terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_> local_6a [5];
  is_false param_2_local;
  uchar *_0__local;
  terminal<boost::spirit::tag::byte_> *this_local;
  uchar *local_48;
  uchar *local_40;
  terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_> *local_38;
  terminal<boost::spirit::tag::byte_> *local_30;
  undefined8 local_28;
  undefined8 local_20;
  terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_> *local_18;
  terminal<boost::spirit::tag::byte_> *local_10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_>_>,_0L>
  *that;
  
  param_2_local = param_2;
  _0__local = _0_;
  this_local = this;
  fusion::make_vector<unsigned_char_const&>((fusion *)&local_6b,(uchar *)param_2);
  local_48 = _0_;
  local_40 = _0_;
  terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_>::terminal_ex
            (local_6a,&local_6b,(byte_ *)_0_);
  local_38 = local_6a;
  local_20 = 0;
  local_28 = 0;
  local_30 = this;
  local_18 = local_38;
  local_10 = this;
  terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_>::terminal_ex
            ((terminal_ex<boost::spirit::tag::byte_,_boost::fusion::vector<unsigned_char>_> *)this,
             local_38);
  return (type)SUB82(this,0);
}

Assistant:

typename result<A0>::type
        operator()(A0 const& _0_
          , typename detail::contains_actor<A0>::is_false = 0) const
        {
            typedef typename result<A0>::type result_type;
            typedef typename result_type::proto_child0 child_type;
            return result_type::make(
                child_type(
                    detail::make_vector(_0_)
                  , this->proto_base().child0)
            );
        }